

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.cxx
# Opt level: O0

void __thiscall xray_re::xr_reader::r_s(xr_reader *this,string *value)

{
  bool bVar1;
  uchar *local_20;
  uint8_t *p;
  string *value_local;
  xr_reader *this_local;
  
  local_20 = (this->field_2).m_p;
  if (this->m_end <= local_20) {
    __assert_fail("p < m_end",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.cxx"
                  ,0x7f,"void xray_re::xr_reader::r_s(std::string &)");
  }
  while( true ) {
    bVar1 = false;
    if ((local_20 != this->m_end) && (bVar1 = false, *local_20 != '\n')) {
      bVar1 = *local_20 != '\r';
    }
    if (!bVar1) break;
    local_20 = local_20 + 1;
  }
  std::__cxx11::string::assign<unsigned_char_const*,void>
            ((string *)value,(this->field_2).m_p,local_20);
  while( true ) {
    bVar1 = false;
    if ((local_20 != this->m_end) && (bVar1 = true, *local_20 != '\n')) {
      bVar1 = *local_20 == '\r';
    }
    if (!bVar1) break;
    local_20 = local_20 + 1;
  }
  (this->field_2).m_p = local_20;
  return;
}

Assistant:

void xr_reader::r_s(std::string& value)
{
	const uint8_t* p = m_p;
	xr_assert(p < m_end);
	while (p != m_end && *p != '\n' && *p != '\r')
		++p;
	value.assign(m_p, p);
	while (p != m_end && (*p == '\n' || *p == '\r'))
		++p;
	m_p = p;
}